

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_OES_draw_buffers_indexed(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_OES_draw_buffers_indexed != 0) {
    glad_glEnableiOES = (PFNGLENABLEIOESPROC)(*load)("glEnableiOES");
    glad_glDisableiOES = (PFNGLDISABLEIOESPROC)(*load)("glDisableiOES");
    glad_glBlendEquationiOES = (PFNGLBLENDEQUATIONIOESPROC)(*load)("glBlendEquationiOES");
    glad_glBlendEquationSeparateiOES =
         (PFNGLBLENDEQUATIONSEPARATEIOESPROC)(*load)("glBlendEquationSeparateiOES");
    glad_glBlendFunciOES = (PFNGLBLENDFUNCIOESPROC)(*load)("glBlendFunciOES");
    glad_glBlendFuncSeparateiOES =
         (PFNGLBLENDFUNCSEPARATEIOESPROC)(*load)("glBlendFuncSeparateiOES");
    glad_glColorMaskiOES = (PFNGLCOLORMASKIOESPROC)(*load)("glColorMaskiOES");
    glad_glIsEnablediOES = (PFNGLISENABLEDIOESPROC)(*load)("glIsEnablediOES");
  }
  return;
}

Assistant:

static void load_GL_OES_draw_buffers_indexed(GLADloadproc load) {
	if(!GLAD_GL_OES_draw_buffers_indexed) return;
	glad_glEnableiOES = (PFNGLENABLEIOESPROC)load("glEnableiOES");
	glad_glDisableiOES = (PFNGLDISABLEIOESPROC)load("glDisableiOES");
	glad_glBlendEquationiOES = (PFNGLBLENDEQUATIONIOESPROC)load("glBlendEquationiOES");
	glad_glBlendEquationSeparateiOES = (PFNGLBLENDEQUATIONSEPARATEIOESPROC)load("glBlendEquationSeparateiOES");
	glad_glBlendFunciOES = (PFNGLBLENDFUNCIOESPROC)load("glBlendFunciOES");
	glad_glBlendFuncSeparateiOES = (PFNGLBLENDFUNCSEPARATEIOESPROC)load("glBlendFuncSeparateiOES");
	glad_glColorMaskiOES = (PFNGLCOLORMASKIOESPROC)load("glColorMaskiOES");
	glad_glIsEnablediOES = (PFNGLISENABLEDIOESPROC)load("glIsEnablediOES");
}